

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::VideoTrack::SetProjection(VideoTrack *this,Projection *projection)

{
  bool bVar1;
  ProjectionType type;
  Projection *pPVar2;
  pointer pPVar3;
  uint8_t *puVar4;
  uint64_t data_length;
  float fVar5;
  unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> local_28;
  unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_> projection_ptr;
  Projection *projection_local;
  VideoTrack *this_local;
  
  projection_ptr._M_t.
  super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>.
  super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>,_true,_true>
       )(__uniq_ptr_data<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>,_true,_true>
         )projection;
  pPVar2 = (Projection *)operator_new(0x20);
  Projection::Projection(pPVar2);
  std::unique_ptr<mkvmuxer::Projection,std::default_delete<mkvmuxer::Projection>>::
  unique_ptr<std::default_delete<mkvmuxer::Projection>,void>
            ((unique_ptr<mkvmuxer::Projection,std::default_delete<mkvmuxer::Projection>> *)&local_28
             ,pPVar2);
  pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::get
                     (&local_28);
  if (pPVar3 == (pointer)0x0) {
    this_local._7_1_ = false;
  }
  else {
    puVar4 = Projection::private_data
                       ((Projection *)
                        projection_ptr._M_t.
                        super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                        .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
    if (puVar4 != (uint8_t *)0x0) {
      pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
               operator->(&local_28);
      puVar4 = Projection::private_data
                         ((Projection *)
                          projection_ptr._M_t.
                          super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                          .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
      data_length = Projection::private_data_length
                              ((Projection *)
                               projection_ptr._M_t.
                               super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                               .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
      bVar1 = Projection::SetProjectionPrivate(pPVar3,puVar4,data_length);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_0013f58b;
      }
    }
    pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->(&local_28);
    type = Projection::type((Projection *)
                            projection_ptr._M_t.
                            super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                            .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
    Projection::set_type(pPVar3,type);
    pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->(&local_28);
    fVar5 = Projection::pose_yaw
                      ((Projection *)
                       projection_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                       .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
    Projection::set_pose_yaw(pPVar3,fVar5);
    pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->(&local_28);
    fVar5 = Projection::pose_pitch
                      ((Projection *)
                       projection_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                       .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
    Projection::set_pose_pitch(pPVar3,fVar5);
    pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             operator->(&local_28);
    fVar5 = Projection::pose_roll
                      ((Projection *)
                       projection_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::Projection_*,_std::default_delete<mkvmuxer::Projection>_>
                       .super__Head_base<0UL,_mkvmuxer::Projection_*,_false>._M_head_impl);
    Projection::set_pose_roll(pPVar3,fVar5);
    pPVar2 = this->projection_;
    if (pPVar2 != (Projection *)0x0) {
      Projection::~Projection(pPVar2);
      operator_delete(pPVar2);
    }
    pPVar3 = std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::
             release(&local_28);
    this->projection_ = pPVar3;
    this_local._7_1_ = true;
  }
LAB_0013f58b:
  std::unique_ptr<mkvmuxer::Projection,_std::default_delete<mkvmuxer::Projection>_>::~unique_ptr
            (&local_28);
  return this_local._7_1_;
}

Assistant:

bool VideoTrack::SetProjection(const Projection& projection) {
  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  if (projection.private_data()) {
    if (!projection_ptr->SetProjectionPrivate(
            projection.private_data(), projection.private_data_length())) {
      return false;
    }
  }

  projection_ptr->set_type(projection.type());
  projection_ptr->set_pose_yaw(projection.pose_yaw());
  projection_ptr->set_pose_pitch(projection.pose_pitch());
  projection_ptr->set_pose_roll(projection.pose_roll());
  delete projection_;
  projection_ = projection_ptr.release();
  return true;
}